

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

bool __thiscall tinyxml2::XMLPrinter::Visit(XMLPrinter *this,XMLText *text)

{
  char *text_00;
  
  text_00 = XMLNode::Value(&text->super_XMLNode);
  PushText(this,text_00,text->_isCData);
  return true;
}

Assistant:

bool XMLPrinter::Visit( const XMLText& text )
{
    PushText( text.Value(), text.CData() );
    return true;
}